

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void diy::mpi::detail::get
               (DIY_MPI_Win *win,void *data,int count,datatype *type,int rank,uint offset)

{
  MPI_Datatype poVar1;
  
  poVar1 = (type->handle).data;
  MPI_Get(data,count,poVar1,rank,offset,count,poVar1,win->data);
  return;
}

Assistant:

void get(const DIY_MPI_Win& win, void* data, int count, const datatype& type, int rank, unsigned offset)
{
#if DIY_HAS_MPI
  MPI_Get(data, count, mpi_cast(type.handle), rank, offset, count, mpi_cast(type.handle), mpi_cast(win));
#else
  const void* buffer = mpi_cast(win).data();
  size_t size = mpi_cast(type.handle);
  std::copy_n(static_cast<const int8_t*>(buffer) + (offset * size),
              size * static_cast<size_t>(count),
              static_cast<int8_t*>(data));
  (void)rank;
#endif
}